

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O2

void convert<unsigned_char,unsigned_short>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  size_type __new_size;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dst;
  key_type local_78;
  long local_70;
  ulong local_68;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  uVar5 = (long)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_70 = uVar5 << 0x20;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,(long)(int)uVar5,
             (allocator_type *)&local_78);
  uVar7 = 0;
  local_68 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    local_68 = uVar7;
  }
  for (; local_68 != uVar7; uVar7 = uVar7 + 1) {
    bVar4 = (src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7];
    local_78._M_target = (type_info *)&unsigned_char::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleOffset,&local_78);
    fVar1 = *pmVar6;
    local_50._M_target = (type_info *)&unsigned_char::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleScale,&local_50);
    fVar2 = *pmVar6;
    local_58._M_target = (type_info *)&unsigned_short::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleScale,&local_58);
    fVar3 = *pmVar6;
    local_60._M_target = (type_info *)&unsigned_short::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleOffset,&local_60);
    local_48._M_impl.super__Vector_impl_data._M_start[uVar7] =
         (unsigned_short)(int)((((float)bVar4 - fVar1) / fVar2) * fVar3 + *pmVar6);
  }
  __new_size = local_70 >> 0x1f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(src,__new_size);
  memcpy((src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start,local_48._M_impl.super__Vector_impl_data._M_start,
         __new_size);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void convert(std::vector<uint8_t> & src) {
    const int n = src.size()/sizeof(S);
    std::vector<D> dst(n);
    S v;
    for (int i = 0; i < n; ++i) {
        std::memcpy(&v, &src[i*sizeof(S)], sizeof(S));
        dst[i] = ((float(v) - kSampleOffset.at(typeid(S)))/kSampleScale.at(typeid(S)))*kSampleScale.at(typeid(D)) + kSampleOffset.at(typeid(D));
    }

    src.resize(n*sizeof(D));
    std::memcpy(&src[0], &dst[0], n*sizeof(D));
}